

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<(anonymous_namespace)::ktxTexture1WriteKTX2TestRGBA8_Write2DArray_Test>::CreateTest
          (TestFactoryImpl<(anonymous_namespace)::ktxTexture1WriteKTX2TestRGBA8_Write2DArray_Test>
           *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x188);
  anon_unknown.dwarf_c382::ktxTexture1WriteKTX2TestRGBA8::ktxTexture1WriteKTX2TestRGBA8
            ((ktxTexture1WriteKTX2TestRGBA8 *)this_00);
  (((ktxTexture1WriteKTX2TestBase<unsigned_char,_4U,_32856U> *)&this_00->_vptr_Test)->
  super_ktxTexture1WriteTestBase<unsigned_char,_4U,_32856U>).super_Test._vptr_Test =
       (_func_int **)&PTR__ktxTexture1WriteTestBase_0018d778;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }